

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O3

void __thiscall
t_c_glib_generator::generate_deserialize_set_element
          (t_c_glib_generator *this,ostream *out,t_set *tset,string *prefix,int error_ret)

{
  int *piVar1;
  t_type *ttype;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  char *__s;
  string elem;
  string telem_ptr;
  t_field felem;
  string local_1a0;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  t_field local_e0;
  
  ttype = tset->elem_type_;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"_elem","");
  t_generator::tmp(&local_1a0,(t_generator *)this,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[6])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
    __s = "";
    if ((char)iVar2 != '\0') {
      __s = "*";
    }
  }
  else {
    __s = "";
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,__s,__s + sVar3);
  declare_local_variable(this,out,ttype,&local_1a0,true);
  std::operator+(&local_120,&local_140,&local_1a0);
  t_field::t_field(&local_e0,ttype,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
  generate_deserialize_field(this,out,&local_e0,&local_160,&local_180,error_ret,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if (",4);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," && ",4);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"g_hash_table_insert ((GHashTable *) ",0x24);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", (gpointer) ",0xd);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", (gpointer) ",0xd);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_field::~t_field(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_c_glib_generator::generate_deserialize_set_element(ostream& out,
                                                          t_set* tset,
                                                          string prefix,
                                                          int error_ret) {
  t_type* telem = tset->get_elem_type();
  string elem = tmp("_elem");
  string telem_ptr = telem->is_string() || !telem->is_base_type() ? "" : "*";

  declare_local_variable(out, telem, elem, true);

  t_field felem(telem, telem_ptr + elem);
  generate_deserialize_field(out, &felem, "", "", error_ret);

  indent(out) << "if (" << prefix << " && " << elem << ")" << endl;
  indent_up();
  indent(out) << "g_hash_table_insert ((GHashTable *) " << prefix << ", (gpointer) " << elem
              << ", (gpointer) " << elem << ");" << endl;
  indent_down();
}